

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_9_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_append_string_node(&G->data,(G->data).literal_str,G->val[-1]);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_9_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_9_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {APPEND_N(v); }\n"));
  APPEND_N(v); ;
#undef v
#undef k
#undef h
#undef e
}